

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

internals * pybind11::detail::get_internals(void)

{
  internals **ppiVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  object *poVar5;
  internals *piVar6;
  long lVar7;
  Py_tss_t *pPVar8;
  _Fwd_list_node_base *p_Var9;
  PyTypeObject *pPVar10;
  PyObject *pPVar11;
  handle builtins;
  char *id;
  handle local_50;
  item_accessor local_48;
  undefined8 local_28;
  char *local_20;
  
  if ((get_internals_pp()::internals_pp != (internals **)0x0) &&
     (*get_internals_pp()::internals_pp != (internals *)0x0)) {
    return *get_internals_pp()::internals_pp;
  }
  uVar3 = PyGILState_Ensure();
  local_20 = "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__";
  local_28 = PyEval_GetBuiltins();
  bVar2 = object_api<pybind11::handle>::contains<char_const*const&>
                    ((object_api<pybind11::handle> *)&local_28,&local_20);
  if (bVar2) {
    object_api<pybind11::handle>::operator[]
              (&local_48,(object_api<pybind11::handle> *)&local_28,
               "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
    poVar5 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_48);
    local_50.m_ptr = (poVar5->super_handle).m_ptr;
    if (local_50.m_ptr == (PyObject *)0x0) {
      object::~object((object *)&local_50);
      object::~object(&local_48.cache);
      object::~object(&local_48.key);
    }
    else {
      (local_50.m_ptr)->ob_refcnt = (local_50.m_ptr)->ob_refcnt + 1;
      pPVar10 = (local_50.m_ptr)->ob_type;
      object::~object((object *)&local_50);
      object::~object(&local_48.cache);
      object::~object(&local_48.key);
      if (pPVar10 == (PyTypeObject *)&PyCapsule_Type) {
        object_api<pybind11::handle>::operator[]
                  (&local_48,(object_api<pybind11::handle> *)&local_28,
                   "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
        capsule::capsule<pybind11::detail::accessor_policies::generic_item>
                  ((capsule *)&local_50,&local_48);
        get_internals_pp()::internals_pp =
             capsule::operator_cast_to_internals__((capsule *)&local_50);
        object::~object((object *)&local_50);
        object::~object(&local_48.cache);
        object::~object(&local_48.key);
        goto LAB_0010a438;
      }
    }
  }
  if (get_internals_pp()::internals_pp == (internals **)0x0) {
    get_internals_pp()::internals_pp = (internals **)operator_new(8);
    *get_internals_pp()::internals_pp = (internals *)0x0;
  }
  ppiVar1 = get_internals_pp()::internals_pp;
  piVar6 = (internals *)operator_new(0x1d8);
  memset(&(piVar6->registered_types_cpp)._M_h._M_rehash_policy,0,0x1b0);
  (piVar6->registered_types_cpp)._M_h._M_buckets =
       &(piVar6->registered_types_cpp)._M_h._M_single_bucket;
  (piVar6->registered_types_cpp)._M_h._M_bucket_count = 1;
  (piVar6->registered_types_cpp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->registered_types_cpp)._M_h._M_element_count = 0;
  (piVar6->registered_types_cpp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->registered_types_cpp)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->registered_types_cpp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->registered_types_py)._M_h._M_buckets =
       &(piVar6->registered_types_py)._M_h._M_single_bucket;
  (piVar6->registered_types_py)._M_h._M_bucket_count = 1;
  (piVar6->registered_types_py)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->registered_types_py)._M_h._M_element_count = 0;
  (piVar6->registered_types_py)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->registered_types_py)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->registered_types_py)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->registered_instances)._M_h._M_buckets =
       &(piVar6->registered_instances)._M_h._M_single_bucket;
  (piVar6->registered_instances)._M_h._M_bucket_count = 1;
  (piVar6->registered_instances)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->registered_instances)._M_h._M_element_count = 0;
  (piVar6->registered_instances)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->registered_instances)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->registered_instances)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->inactive_overload_cache)._M_h._M_buckets =
       &(piVar6->inactive_overload_cache)._M_h._M_single_bucket;
  (piVar6->inactive_overload_cache)._M_h._M_bucket_count = 1;
  (piVar6->inactive_overload_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->inactive_overload_cache)._M_h._M_element_count = 0;
  (piVar6->inactive_overload_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->inactive_overload_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->inactive_overload_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->direct_conversions)._M_h._M_buckets = &(piVar6->direct_conversions)._M_h._M_single_bucket
  ;
  (piVar6->direct_conversions)._M_h._M_bucket_count = 1;
  (piVar6->direct_conversions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->direct_conversions)._M_h._M_element_count = 0;
  (piVar6->direct_conversions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->direct_conversions)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->direct_conversions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->patients)._M_h._M_buckets = &(piVar6->patients)._M_h._M_single_bucket;
  (piVar6->patients)._M_h._M_bucket_count = 1;
  (piVar6->patients)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->patients)._M_h._M_element_count = 0;
  (piVar6->patients)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->patients)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->patients)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->registered_exception_translators).
  super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  (piVar6->shared_data)._M_h._M_buckets = &(piVar6->shared_data)._M_h._M_single_bucket;
  (piVar6->shared_data)._M_h._M_bucket_count = 1;
  (piVar6->shared_data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (piVar6->shared_data)._M_h._M_element_count = 0;
  (piVar6->shared_data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (piVar6->shared_data)._M_h._M_rehash_policy._M_next_resize = 0;
  (piVar6->shared_data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (piVar6->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (piVar6->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (piVar6->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (piVar6->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  piVar6->tstate = (Py_tss_t *)0x0;
  piVar6->istate = (PyInterpreterState *)0x0;
  *ppiVar1 = piVar6;
  lVar7 = PyThreadState_Get();
  pPVar8 = (Py_tss_t *)PyThread_tss_alloc();
  (*ppiVar1)->tstate = pPVar8;
  if (((*ppiVar1)->tstate == (Py_tss_t *)0x0) || (iVar4 = PyThread_tss_create(), iVar4 != 0)) {
    pybind11_fail("get_internals: could not successfully initialize the TSS key!");
  }
  PyThread_tss_set((*ppiVar1)->tstate,lVar7);
  (*ppiVar1)->istate = *(PyInterpreterState **)(lVar7 + 0x10);
  capsule::capsule((capsule *)&local_50,get_internals_pp()::internals_pp,(char *)0x0,
                   (_func_void_PyObject_ptr *)0x0);
  object_api<pybind11::handle>::operator[]
            (&local_48,(object_api<pybind11::handle> *)&local_28,
             "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
  accessor_policies::generic_item::set(local_48.obj,local_48.key.super_handle,local_50);
  object::~object(&local_48.cache);
  object::~object(&local_48.key);
  object::~object((object *)&local_50);
  piVar6 = *ppiVar1;
  p_Var9 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var9[1]._M_next = (_Fwd_list_node_base *)translate_exception;
  p_Var9->_M_next =
       (piVar6->registered_exception_translators).
       super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
       ._M_impl._M_head._M_next;
  (piVar6->registered_exception_translators).
  super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ._M_impl._M_head._M_next = p_Var9;
  pPVar10 = make_static_property_type();
  (*ppiVar1)->static_property_type = pPVar10;
  pPVar10 = make_default_metaclass();
  (*ppiVar1)->default_metaclass = pPVar10;
  pPVar11 = make_object_base_type((*ppiVar1)->default_metaclass);
  (*ppiVar1)->instance_base = pPVar11;
LAB_0010a438:
  piVar6 = *get_internals_pp()::internals_pp;
  PyGILState_Release(uVar3);
  return piVar6;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp)
        return **internals_pp;

    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state (PyGILState_Ensure()) {}
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;

    constexpr auto *id = PYBIND11_INTERNALS_ID;
    auto builtins = handle(PyEval_GetBuiltins());
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_pp = static_cast<internals **>(capsule(builtins[id]));

        // We loaded builtins through python's builtins, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(&translate_local_exception);
#endif
    } else {
        if (!internals_pp) internals_pp = new internals*();
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();
#if defined(WITH_THREAD)

        #if PY_VERSION_HEX < 0x03090000
                PyEval_InitThreads();
        #endif
        PyThreadState *tstate = PyThreadState_Get();
        #if PY_VERSION_HEX >= 0x03070000
            internals_ptr->tstate = PyThread_tss_alloc();
            if (!internals_ptr->tstate || PyThread_tss_create(internals_ptr->tstate))
                pybind11_fail("get_internals: could not successfully initialize the TSS key!");
            PyThread_tss_set(internals_ptr->tstate, tstate);
        #else
            internals_ptr->tstate = PyThread_create_key();
            if (internals_ptr->tstate == -1)
                pybind11_fail("get_internals: could not successfully initialize the TLS key!");
            PyThread_set_key_value(internals_ptr->tstate, tstate);
        #endif
        internals_ptr->istate = tstate->interp;
#endif
        builtins[id] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(&translate_exception);
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
    }
    return **internals_pp;
}